

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O0

void __thiscall
absl::lts_20250127::Cord::InlineRep::CommitTree
          (InlineRep *this,Nullable<const_CordRep_*> old_rep,Nonnull<CordRep_*> rep,
          CordzUpdateScope *scope,MethodIdentifier method)

{
  MethodIdentifier method_local;
  CordzUpdateScope *scope_local;
  Nonnull<CordRep_*> rep_local;
  Nullable<const_CordRep_*> old_rep_local;
  InlineRep *this_local;
  
  if (old_rep == (Nullable<const_CordRep_*>)0x0) {
    EmplaceTree(this,rep,method);
  }
  else {
    SetTree(this,rep,scope);
  }
  return;
}

Assistant:

inline void Cord::InlineRep::CommitTree(absl::Nullable<const CordRep*> old_rep,
                                        absl::Nonnull<CordRep*> rep,
                                        const CordzUpdateScope& scope,
                                        MethodIdentifier method) {
  if (old_rep) {
    SetTree(rep, scope);
  } else {
    EmplaceTree(rep, method);
  }
}